

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_friends(textblock *tb,monster_race *race,monster_lore_conflict *lore,
                        bitflag *known_flags)

{
  _Bool _Var1;
  monster_sex_t sex;
  char *pcVar2;
  monster_sex_t msex;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    sex = lore_monster_sex(race);
    if ((race->friends != (monster_friends *)0x0) ||
       (race->friends_base != (monster_friends_base *)0x0)) {
      pcVar2 = lore_pronoun_nominative(sex,true);
      textblock_append(tb,"%s may appear with other monsters",pcVar2);
      _Var1 = flag_has_dbg(known_flags,0xc,5,"known_flags","RF_GROUP_AI");
      if (_Var1) {
        textblock_append(tb," and hunts in packs");
      }
      textblock_append(tb,".  ");
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x5c1,
                "void lore_append_friends(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_friends(textblock *tb, const struct monster_race *race,
						 const struct monster_lore *lore,
						 bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Describe friends */
	if (race->friends || race->friends_base) {
		textblock_append(tb, "%s may appear with other monsters",
						 lore_pronoun_nominative(msex, true));
		if (rf_has(known_flags, RF_GROUP_AI))
			textblock_append(tb, " and hunts in packs");
		textblock_append(tb, ".  ");
	}
}